

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O1

_Bool HMAC_Create(COSE_MacMessage *pcose,int HSize,int TSize,byte *pbKey,size_t cbKey,
                 byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  cose_error cVar4;
  mbedtls_md_info_t *md_info;
  uint8_t *output;
  cn_cbor *cb_value;
  char *md_name;
  _Bool _Var5;
  mbedtls_md_context_t local_48;
  
  if (HSize == 0x100) {
    md_name = "SHA256";
LAB_0019bc1c:
    mbedtls_md_init(&local_48);
    md_info = mbedtls_md_info_from_string(md_name);
    mbedtls_md_setup(&local_48,md_info,1);
    bVar1 = mbedtls_md_get_size(md_info);
    output = (uint8_t *)calloc((ulong)bVar1,1);
    if (output == (uint8_t *)0x0) {
      cVar4 = COSE_ERR_OUT_OF_MEMORY;
      goto LAB_0019bcaf;
    }
    iVar3 = mbedtls_md_hmac_starts(&local_48,pbKey,cbKey);
    if (iVar3 == 0) {
      iVar3 = mbedtls_md_hmac_update(&local_48,pbAuthData,cbAuthData);
      if (iVar3 != 0) goto LAB_0019bc9c;
      iVar3 = mbedtls_md_hmac_finish(&local_48,output);
      if (iVar3 != 0) goto LAB_0019bc9c;
      iVar3 = TSize + 7;
      if (-1 < TSize) {
        iVar3 = TSize;
      }
      cb_value = cn_cbor_data_create(output,iVar3 >> 3,(cn_cbor_errback *)0x0);
      _Var2 = _COSE_array_replace(&pcose->m_message,cb_value,3,(cn_cbor_errback *)0x0);
      _Var5 = true;
      if (_Var2) goto LAB_0019bcc3;
      cVar4 = COSE_ERR_CBOR;
    }
    else {
LAB_0019bc9c:
      cVar4 = COSE_ERR_CRYPTO_FAIL;
    }
  }
  else {
    if (HSize == 0x200) {
      md_name = "SHA512";
      goto LAB_0019bc1c;
    }
    if (HSize == 0x180) {
      md_name = "SHA384";
      goto LAB_0019bc1c;
    }
    cVar4 = COSE_ERR_INVALID_PARAMETER;
LAB_0019bcaf:
    output = (uint8_t *)0x0;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = cVar4;
  }
  free(output);
  _Var5 = false;
LAB_0019bcc3:
  mbedtls_md_free(&local_48);
  return _Var5;
}

Assistant:

bool HMAC_Create(COSE_MacMessage * pcose, int HSize, int TSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	byte * rgbOut = NULL;
//	unsigned int cbOut;
	mbedtls_md_context_t contx;
	const char* md_name;
	const struct mbedtls_md_info_t * info;

#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif

	switch (HSize) {
		case 256: md_name = "SHA256"; break;
		case 384: md_name = "SHA384"; break;
		case 512: md_name = "SHA512"; break;
		default: FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER); break;
	}

	if (0) {
	errorReturn:
		COSE_FREE(rgbOut, context);
		mbedtls_md_free(&contx); 
		return false;
	}

	mbedtls_md_init(&contx);
	info = mbedtls_md_info_from_string (md_name);
	mbedtls_md_setup( &contx, info, 1 );

	rgbOut = COSE_CALLOC(mbedtls_md_get_size(info), 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!(mbedtls_md_hmac_starts (&contx, pbKey, cbKey)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_update (&contx, pbAuthData, cbAuthData)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_finish (&contx, rgbOut)), COSE_ERR_CRYPTO_FAIL);

	CHECK_CONDITION(_COSE_array_replace(&pcose->m_message, cn_cbor_data_create(rgbOut, TSize / 8, CBOR_CONTEXT_PARAM_COMMA NULL), INDEX_MAC_TAG, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_CBOR);

	mbedtls_md_free(&contx); 
	return true;
}